

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  ostream *poVar2;
  long lVar3;
  double timestep;
  cb3D_integrator b3D_integrator;
  undefined1 local_d0 [8];
  NetwMin netw_min;
  string local_a0;
  double local_80;
  double creation_rate;
  allocator<char> local_61;
  string local_60 [32];
  string local_40 [8];
  string filename;
  uint bd3D_write_every;
  uint bd3D_nsteps;
  char **argv_local;
  int argc_local;
  
  filename.field_2._12_4_ = 0;
  filename.field_2._8_4_ = 0;
  std::ios_base::precision((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),0xc);
  poVar2 = std::operator<<((ostream *)&std::cout,"#: Use of the code: ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "#: ./netmin.x [data_file] [slip-spring creation rate] [nsteps] [nevery_steps]\n"
                          );
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::string(local_40);
  if (argc < 2) {
    std::operator<<((ostream *)&std::cout,"#: Data file has not been specified from command line.\n"
                   );
    std::__cxx11::string::operator=(local_40,"emsipon.data");
    poVar2 = std::operator<<((ostream *)&std::cout,"#: --- \'");
    poVar2 = std::operator<<(poVar2,local_40);
    std::operator<<(poVar2,"\' will be used as data file.\n");
  }
  else {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_60,pcVar1,&local_61);
    std::__cxx11::string::operator=(local_40,local_60);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  if (argc < 3) {
    argv_local._4_4_ = 1;
    netw_min.my_traj_file._0_4_ = 1;
  }
  else {
    pcVar1 = argv[2];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,pcVar1,(allocator<char> *)((long)&netw_min.my_traj_file + 7));
    local_80 = StringToNumber<double>(&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&netw_min.my_traj_file + 7));
    if (argc < 4) {
      filename.field_2._12_4_ = 2000000000;
    }
    else {
      lVar3 = atol(argv[3]);
      filename.field_2._12_4_ = (undefined4)lVar3;
    }
    if (argc < 5) {
      filename.field_2._8_4_ = 1000;
    }
    else {
      lVar3 = atol(argv[4]);
      filename.field_2._8_4_ = (undefined4)lVar3;
    }
    std::__cxx11::string::string((string *)&b3D_integrator.p_cell_density,local_40);
    NetworkNS::NetwMin::NetwMin((NetwMin *)local_d0,(string *)&b3D_integrator.p_cell_density);
    std::__cxx11::string::~string((string *)&b3D_integrator.p_cell_density);
    NetworkNS::cb3D_integrator::cb3D_integrator
              ((cb3D_integrator *)&timestep,(NetwMin *)local_d0,500.0,local_80);
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "#: Integrator has been initialized. Simulation will start for ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,filename.field_2._12_4_);
    std::operator<<(poVar2," steps.\n");
    poVar2 = std::operator<<((ostream *)&std::cout,"#: The rate for the slip-spring creation is: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_80);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"#: The timestep of the integrator will be: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,1.0);
    std::operator<<(poVar2," ps.\n");
    poVar2 = std::operator<<((ostream *)&std::cout,"#: Report will be written every: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,filename.field_2._8_4_);
    std::operator<<(poVar2," steps.\n");
    NetworkNS::cb3D_integrator::integrate
              ((cb3D_integrator *)&timestep,filename.field_2._12_4_,1.0,filename.field_2._8_4_);
    (*(code *)**(undefined8 **)netw_min.my_rnd_gen)();
    argv_local._4_4_ = 0;
    netw_min.my_traj_file._0_4_ = 1;
    NetworkNS::cb3D_integrator::~cb3D_integrator((cb3D_integrator *)&timestep);
  }
  std::__cxx11::string::~string(local_40);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv) {

    
   unsigned int bd3D_nsteps = 0, bd3D_write_every = 0;
   
   cout.precision(12);
   
   cout << "#: Use of the code: "<< endl;
   cout << "#: ./netmin.x [data_file] [slip-spring creation rate] [nsteps] [nevery_steps]\n" << endl;
   
   std::string filename;
   if (argc > 1)
      filename = std::string(argv[1]);
   else{
      cout << "#: Data file has not been specified from command line.\n";
      filename = "emsipon.data";
      cout << "#: --- '" << filename << "' will be used as data file.\n";
   }
   
   double creation_rate;
   if (argc > 2)
      creation_rate = StringToNumber<double>(argv[2]);
   else
      return(1);
   
   if (argc > 3)
      bd3D_nsteps = atol(argv[3]);
   else
      bd3D_nsteps = 2000000000;
   
   if (argc > 4)
      bd3D_write_every = atol(argv[4]);
   else
      bd3D_write_every = 1000;
      

#ifdef FENE_SLS  
   cout << "#: (warning): FENE potential will be used for slip-springs.\n";
#endif
   
   // Define a new pointer to the class:
   NetwMin netw_min(filename);
   cb3D_integrator b3D_integrator(&netw_min, 500.0, creation_rate);
   
   cout << "#: Integrator has been initialized. Simulation will start for "<<bd3D_nsteps<< " steps.\n";
   cout << "#: The rate for the slip-spring creation is: " << creation_rate << endl;
   
   // Simulation starts here:
   double timestep = 1.0; // integration timestep in ps.
   cout << "#: The timestep of the integrator will be: " << timestep << " ps.\n";
   cout << "#: Report will be written every: " << bd3D_write_every << " steps.\n";
   
   
   b3D_integrator.integrate(bd3D_nsteps, timestep, bd3D_write_every);
     
   // Close trajectory file:
   netw_min.my_traj_file->~dump();
   
   
   return (EXIT_SUCCESS);
}